

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * CompileVmAssignment(ExpressionContext *ctx,VmModule *module,ExprAssignment *node)

{
  TypeBase *type;
  bool bVar1;
  uint uVar2;
  TypeRef *pTVar3;
  VmValue *pVVar4;
  VmValue *node_00;
  VmInstruction *instInit_00;
  TypeArray *typeArray_00;
  VmConstant *pVVar5;
  VmValue **ppVVar6;
  VmInstruction *pVVar7;
  VmValue *copy;
  VmInstruction *elementInst;
  VmValue *element;
  uint i;
  VmConstant *tempAddress;
  VmValue *copy_1;
  VmValue *constant;
  TypeBase *elementType;
  TypeArray *typeArray;
  VmInstruction *instInit;
  VmValue *initializer;
  VmValue *address;
  TypeRef *refType;
  ExprAssignment *node_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  pTVar3 = getType<TypeRef>(node->lhs->type);
  if (pTVar3 == (TypeRef *)0x0) {
    __assert_fail("refType",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xca7,
                  "VmValue *CompileVmAssignment(ExpressionContext &, VmModule *, ExprAssignment *)")
    ;
  }
  if (pTVar3->subType == node->rhs->type) {
    pVVar4 = CompileVm(ctx,module,node->lhs);
    node_00 = CompileVm(ctx,module,node->rhs);
    instInit_00 = getType<VmInstruction>(node_00);
    if ((instInit_00 == (VmInstruction *)0x0) || (instInit_00->cmd != VM_INST_ARRAY)) {
      anon_unknown.dwarf_1a3010::CreateStore
                (ctx,module,(node->super_ExprBase).source,node->rhs->type,pVVar4,node_00,0);
      ctx_local = (ExpressionContext *)
                  anon_unknown.dwarf_1a3010::CheckType(ctx,&node->super_ExprBase,node_00);
    }
    else {
      typeArray_00 = getType<TypeArray>((node->super_ExprBase).type);
      type = typeArray_00->subType;
      bVar1 = IsGoodConstantArray(ctx,module,instInit_00);
      if (bVar1) {
        pVVar5 = GetConstantArrayValue(ctx,(node->super_ExprBase).source,typeArray_00,instInit_00);
        anon_unknown.dwarf_1a3010::CreateStore
                  (ctx,module,(node->super_ExprBase).source,&typeArray_00->super_TypeBase,pVVar4,
                   &pVVar5->super_VmValue,0);
        pVVar4 = anon_unknown.dwarf_1a3010::CreateLoad
                           (ctx,module,(node->super_ExprBase).source,node->rhs->type,pVVar4,0);
        ctx_local = (ExpressionContext *)
                    anon_unknown.dwarf_1a3010::CheckType(ctx,&node->super_ExprBase,pVVar4);
      }
      else {
        pVVar5 = anon_unknown.dwarf_1a3010::CreateAlloca
                           (ctx,module,(node->super_ExprBase).source,node->rhs->type,"array",true);
        for (element._4_4_ = 0; uVar2 = SmallArray<VmValue_*,_4U>::size(&instInit_00->arguments),
            element._4_4_ < uVar2; element._4_4_ = element._4_4_ + 1) {
          ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&instInit_00->arguments,element._4_4_);
          elementInst = (VmInstruction *)*ppVVar6;
          pVVar7 = getType<VmInstruction>((VmValue *)elementInst);
          if (pVVar7 == (VmInstruction *)0x0) {
            anon_unknown.dwarf_1a3010::CreateStore
                      (ctx,module,(node->super_ExprBase).source,type,&pVVar5->super_VmValue,
                       (VmValue *)elementInst,(int)type->size * element._4_4_);
          }
          else {
            if (pVVar7->cmd == VM_INST_DOUBLE_TO_FLOAT) {
              ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&pVVar7->arguments,0);
              elementInst = (VmInstruction *)*ppVVar6;
            }
            if (pVVar7->parent == module->currentBlock) {
              module->currentBlock->insertPoint = pVVar7;
              anon_unknown.dwarf_1a3010::CreateStore
                        (ctx,module,(node->super_ExprBase).source,type,&pVVar5->super_VmValue,
                         &elementInst->super_VmValue,(int)type->size * element._4_4_);
              module->currentBlock->insertPoint = module->currentBlock->lastInstruction;
            }
            else {
              anon_unknown.dwarf_1a3010::CreateStore
                        (ctx,module,(node->super_ExprBase).source,type,&pVVar5->super_VmValue,
                         &elementInst->super_VmValue,(int)type->size * element._4_4_);
            }
          }
        }
        anon_unknown.dwarf_1a3010::CreateMemCopy
                  (module,(node->super_ExprBase).source,pVVar4,0,&pVVar5->super_VmValue,0,
                   (int)(typeArray_00->super_TypeBase).size);
        pVVar4 = anon_unknown.dwarf_1a3010::CreateLoad
                           (ctx,module,(node->super_ExprBase).source,node->rhs->type,pVVar4,0);
        ctx_local = (ExpressionContext *)
                    anon_unknown.dwarf_1a3010::CheckType(ctx,&node->super_ExprBase,pVVar4);
      }
    }
    return (VmValue *)ctx_local;
  }
  __assert_fail("refType->subType == node->rhs->type",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0xca8,
                "VmValue *CompileVmAssignment(ExpressionContext &, VmModule *, ExprAssignment *)");
}

Assistant:

VmValue* CompileVmAssignment(ExpressionContext &ctx, VmModule *module, ExprAssignment *node)
{
	TypeRef *refType = getType<TypeRef>(node->lhs->type);

	(void)refType;
	assert(refType);
	assert(refType->subType == node->rhs->type);

	VmValue *address = CompileVm(ctx, module, node->lhs);

	VmValue *initializer = CompileVm(ctx, module, node->rhs);

	if(VmInstruction *instInit = getType<VmInstruction>(initializer))
	{
		// Array initializers are compiled to per-element assignments
		if(instInit->cmd == VM_INST_ARRAY)
		{
			TypeArray *typeArray = getType<TypeArray>(node->type);

			TypeBase *elementType = typeArray->subType;

			if(IsGoodConstantArray(ctx, module, instInit))
			{
				VmValue *constant = GetConstantArrayValue(ctx, node->source, typeArray, instInit);

				CreateStore(ctx, module, node->source, typeArray, address, constant, 0);

				VmValue *copy = CreateLoad(ctx, module, node->source, node->rhs->type, address, 0);

				return CheckType(ctx, node, copy);
			}

			VmConstant *tempAddress = CreateAlloca(ctx, module, node->source, node->rhs->type, "array", true);

			for(unsigned i = 0; i < instInit->arguments.size(); i++)
			{
				VmValue *element = instInit->arguments[i];

				VmInstruction *elementInst = getType<VmInstruction>(element);

				if(elementInst)
				{
					if(elementInst->cmd == VM_INST_DOUBLE_TO_FLOAT)
						element = elementInst->arguments[0];

					if(elementInst->parent == module->currentBlock)
					{
						module->currentBlock->insertPoint = elementInst;

						CreateStore(ctx, module, node->source, elementType, tempAddress, element, unsigned(elementType->size * i));

						module->currentBlock->insertPoint = module->currentBlock->lastInstruction;
					}
					else
					{
						CreateStore(ctx, module, node->source, elementType, tempAddress, element, unsigned(elementType->size * i));
					}
				}
				else
				{
					CreateStore(ctx, module, node->source, elementType, tempAddress, element, unsigned(elementType->size * i));
				}
			}

			CreateMemCopy(module, node->source, address, 0, tempAddress, 0, int(typeArray->size));

			VmValue *copy = CreateLoad(ctx, module, node->source, node->rhs->type, address, 0);

			return CheckType(ctx, node, copy);
		}
	}

	CreateStore(ctx, module, node->source, node->rhs->type, address, initializer, 0);

	return CheckType(ctx, node, initializer);
}